

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

hbtrie_result hbtrie_next_value_only(hbtrie_iterator *it,void *value_buf)

{
  list_elem *plVar1;
  void *in_RSI;
  hbtrie_iterator *in_RDI;
  btreeit_item *item;
  list_elem *e;
  hbtrie_result hr;
  btreeit_item *local_30;
  hbtrie_result local_4;
  
  if (in_RDI->curkey == (void *)0x0) {
    local_4 = HBTRIE_RESULT_FAIL;
  }
  else {
    plVar1 = list_begin(&in_RDI->btreeit_list);
    local_30 = (btreeit_item *)0x0;
    if (plVar1 != (list_elem *)0x0) {
      local_30 = (btreeit_item *)(plVar1 + -7);
    }
    local_4 = _hbtrie_next(in_RDI,local_30,(void *)0x0,(size_t *)0x0,in_RSI,'\x01');
    if (local_4 != HBTRIE_RESULT_SUCCESS) {
      free(in_RDI->curkey);
      in_RDI->curkey = (void *)0x0;
    }
  }
  return local_4;
}

Assistant:

hbtrie_result hbtrie_next_value_only(struct hbtrie_iterator *it,
                                     void *value_buf)
{
    hbtrie_result hr;

    if (it->curkey == NULL) return HBTRIE_RESULT_FAIL;

    struct list_elem *e = list_begin(&it->btreeit_list);
    struct btreeit_item *item = NULL;
    if (e) item = _get_entry(e, struct btreeit_item, le);

    hr = _hbtrie_next(it, item, NULL, 0, value_buf, HBTRIE_PREFIX_MATCH_ONLY);
    if (hr != HBTRIE_RESULT_SUCCESS) {
        // this iterator reaches the end of hb-trie
        free(it->curkey);
        it->curkey = NULL;
    }
    return hr;
}